

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance.cpp
# Opt level: O2

void __thiscall FloatInstance::FloatInstance(FloatInstance *this,float value)

{
  allocator local_35;
  float local_34;
  string local_30;
  
  local_34 = value;
  std::__cxx11::string::string((string *)&local_30,"Float",&local_35);
  Instance::Instance(&this->super_Instance,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  (this->super_Instance)._vptr_Instance = (_func_int **)&PTR__CharacterInstance_0017beb0;
  this->_value = local_34;
  return;
}

Assistant:

FloatInstance::FloatInstance(float value) : Instance("Float") {
    _value = value;
}